

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptesttest.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  HelloWorld greeter;
  long *local_50 [2];
  long local_40 [2];
  long *local_30;
  long local_28;
  long local_20 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Hello World!","");
  HelloWorld::HelloWorld((HelloWorld *)&local_30,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  HelloWorld::Print();
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50," Have a good one!","");
  HelloWorld::Append((string *)&local_30);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  HelloWorld::Print();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The message: ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_30,local_28);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  HelloWorld::Reverse();
  HelloWorld::Print();
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return 0;
}

Assistant:

int main()
{
    HelloWorld greeter("Hello World!");
    greeter.Print();
    greeter.Append(" Have a good one!");
    greeter.Print();
    std::cout << "The message: " << greeter.GetMessage() << std::endl;
    greeter.Reverse();
    greeter.Print();
}